

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<Qentem::Value<char>_>::ResizeAndInitialize
          (Array<Qentem::Value<char>_> *this,SizeT new_size)

{
  SizeT SVar1;
  Value<char> *pVVar2;
  Value<char> *current;
  SizeT new_size_local;
  Array<Qentem::Value<char>_> *this_local;
  
  Resize(this,new_size);
  SVar1 = Size(this);
  if (SVar1 < new_size) {
    pVVar2 = Storage(this);
    SVar1 = Size(this);
    Memory::Initialize<Qentem::Value<char>>(pVVar2 + SVar1,pVVar2 + new_size);
  }
  SVar1 = Capacity(this);
  setSize(this,SVar1);
  return;
}

Assistant:

void ResizeAndInitialize(SizeT new_size) {
        Resize(new_size);

        if (new_size > Size()) {
            Type_T *current = Storage();
            Memory::Initialize((current + Size()), (current + new_size));
        }

        setSize(Capacity());
    }